

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testAttachmentSize
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  OutOfMemoryError *ex;
  int sizeReductionIndex;
  CaseDef_conflict *caseDef_local;
  Context *context_local;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  testWithSizeReduction(__return_storage_ptr__,context,caseDef,0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testAttachmentSize (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	int sizeReductionIndex = 0;

	for (;;)
	{
		try
		{
			return testWithSizeReduction(context, caseDef, sizeReductionIndex);
		}
		catch (OutOfMemoryError& ex)
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "-- OutOfMemoryError: " << ex.getMessage() << tcu::TestLog::EndMessage;

			++sizeReductionIndex;
		}
	}
	// Never reached
}